

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboCases::SharedColorbufferTest::render
          (SharedColorbufferTest *this,Context *context,Surface *dst)

{
  FboConfig *config;
  GLenum GVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int i;
  deUint32 program;
  deUint32 program_00;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int in_R9D;
  Vec4 local_3f8;
  Vec4 local_3e8;
  Surface *local_3d0;
  TextureFormat local_3c8;
  Framebuffer fboA;
  Framebuffer fboB;
  FlatColorShader flatShader;
  FboConfig cfg;
  Texture2DShader texShader;
  
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fboA.m_config.buffers = 0x28;
  local_3d0 = dst;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&flatShader,(iterator)0x0,
             (DataType *)&fboA);
  lVar6 = 0;
  do {
    (&fboA.m_config.buffers)[lVar6] = 0x3f800000;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  fboB.m_config.buffers = 0;
  fboB.m_config.colorType = 0;
  fboB.m_config.colorFormat = 0;
  fboB.m_config.depthStencilType = 0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texShader,(DataTypes *)&flatShader,TYPE_FLOAT_VEC4,(Vec4 *)&fboA,(Vec4 *)&fboB);
  if (flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0) {
    operator_delete(flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader);
  }
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  program = (*context->_vptr_Context[0x75])(context,&texShader);
  program_00 = (*context->_vptr_Context[0x75])(context,&flatShader);
  uVar4 = (this->super_FboRenderCase).m_config.buffers;
  (*context->_vptr_Context[0x34])(context,0xbd0);
  createQuadsTex2D(context,1,0x1907,0x40,0x40,in_R9D);
  createMetaballsTex2D(context,2,0x1908,0x40,0x40,in_R9D);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  config = &(this->super_FboRenderCase).m_config;
  Functional::Framebuffer::Framebuffer(&fboA,context,config,0x80,0x80,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fboA);
  uVar2 = config->buffers;
  uVar3 = (this->super_FboRenderCase).m_config.depthStencilType;
  cfg.depthStencilFormat = (this->super_FboRenderCase).m_config.depthStencilFormat;
  cfg.width = (this->super_FboRenderCase).m_config.width;
  cfg.height = (this->super_FboRenderCase).m_config.height;
  cfg.samples = (this->super_FboRenderCase).m_config.samples;
  cfg.buffers._0_1_ = (undefined1)uVar2;
  cfg.buffers._1_1_ = (byte)((uint)uVar2 >> 8);
  cfg.buffers._2_2_ = (undefined2)((uint)uVar2 >> 0x10);
  cfg.buffers._1_1_ = cfg.buffers._1_1_ & 0xbf;
  cfg.colorType = 0;
  cfg.colorFormat = 0;
  cfg.depthStencilType = uVar3;
  Functional::Framebuffer::Framebuffer(&fboB,context,&cfg,0x80,0x80,0,0,0);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboB.m_framebuffer);
  GVar1 = (this->super_FboRenderCase).m_config.colorType;
  if (GVar1 == 0xde1) {
    (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,(ulong)fboA.m_colorBuffer,0);
  }
  else if (GVar1 == 0x8d41) {
    (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,(ulong)fboA.m_colorBuffer);
  }
  (*context->_vptr_Context[0x2d])(context,0x500);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboA.m_framebuffer);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  if ((uVar4 >> 10 & 1) != 0) {
    (*context->_vptr_Context[0x2c])(context,1);
    (*context->_vptr_Context[0x2d])(context,0x400);
  }
  FboTestUtil::Texture2DShader::setUniforms(&texShader,context,program);
  (*context->_vptr_Context[0x33])(context,0xb71);
  local_3f8.m_data[0] = -1.0;
  local_3f8.m_data[1] = -1.0;
  local_3f8.m_data[2] = 0.0;
  local_3e8.m_data._0_8_ = &DAT_3f8000003f800000;
  local_3e8.m_data[2] = 0.0;
  sglr::drawQuad(context,program,(Vec3 *)&local_3f8,(Vec3 *)&local_3e8);
  (*context->_vptr_Context[0x34])(context,0xb71);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboB.m_framebuffer);
  (*context->_vptr_Context[6])(context,0xde1,2);
  (*context->_vptr_Context[0x33])(context,0xbe2);
  (*context->_vptr_Context[0x42])(context,0x302,0x303,0,1);
  local_3f8.m_data[0] = -1.0;
  local_3f8.m_data[1] = -1.0;
  local_3f8.m_data[2] = 0.0;
  local_3e8.m_data._0_8_ = &DAT_3f8000003f800000;
  local_3e8.m_data[2] = 0.0;
  sglr::drawQuad(context,program,(Vec3 *)&local_3f8,(Vec3 *)&local_3e8);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x33])(context,0xb71);
  local_3f8.m_data._0_8_ = &DAT_3f0000003f000000;
  local_3f8.m_data[2] = 0.5;
  local_3e8.m_data._0_8_ = &DAT_3f8000003f800000;
  local_3e8.m_data[2] = 0.5;
  sglr::drawQuad(context,program,(Vec3 *)&local_3f8,(Vec3 *)&local_3e8);
  (*context->_vptr_Context[0x34])(context,0xb71);
  if ((uVar4 >> 10 & 1) != 0) {
    local_3f8.m_data[0] = 0.0;
    local_3f8.m_data[1] = 1.0;
    local_3f8.m_data[2] = 0.0;
    local_3f8.m_data[3] = 1.0;
    FboTestUtil::FlatColorShader::setColor(&flatShader,context,program_00,&local_3f8);
    (*context->_vptr_Context[0x33])(context,0xc11);
    (*context->_vptr_Context[0x32])(context,10,10,0xc,0x19);
    (*context->_vptr_Context[0x2c])(context,1);
    (*context->_vptr_Context[0x2d])(context,0x400);
    (*context->_vptr_Context[0x34])(context,0xc11);
    (*context->_vptr_Context[0x33])(context,0xb90);
    (*context->_vptr_Context[0x35])(context,0x202,1,0xff);
    local_3f8.m_data._0_8_ = (undefined1 *)0xbf800000bf800000;
    local_3f8.m_data._8_8_ = local_3f8.m_data._8_8_ & 0xffffffff00000000;
    local_3e8.m_data._0_8_ = &DAT_3f8000003f800000;
    local_3e8.m_data[2] = 0.0;
    sglr::drawQuad(context,program_00,(Vec3 *)&local_3f8,(Vec3 *)&local_3e8);
    (*context->_vptr_Context[0x34])(context,0xb90);
  }
  if (fboA.m_config.colorType == 0xde1) {
    FboTestUtil::Texture2DShader::setUniforms(&texShader,context,program);
    (*context->_vptr_Context[9])(context,0x8d40,0);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)fboA.m_colorBuffer);
    uVar4 = (*context->_vptr_Context[2])(context);
    uVar5 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar4,(ulong)uVar5);
    local_3f8.m_data._0_8_ = (undefined1 *)0xbf800000bf800000;
    local_3f8.m_data._8_8_ = local_3f8.m_data._8_8_ & 0xffffffff00000000;
    local_3e8.m_data._0_8_ = &DAT_3f8000003f800000;
    local_3e8.m_data._8_8_ = (ulong)(uint)local_3e8.m_data[3] << 0x20;
    sglr::drawQuad(context,program,(Vec3 *)&local_3f8,(Vec3 *)&local_3e8);
    uVar4 = (*context->_vptr_Context[2])(context);
    uVar5 = (*context->_vptr_Context[3])(context);
    (*context->_vptr_Context[0x80])(context,local_3d0,0,0,(ulong)uVar4,(ulong)uVar5);
  }
  else {
    local_3c8 = glu::mapGLInternalFormat(fboA.m_config.colorFormat);
    lVar6 = 0;
    do {
      local_3f8.m_data[lVar6] = 1.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    local_3e8.m_data._0_8_ = (undefined1 *)0x0;
    local_3e8.m_data[2] = 0.0;
    local_3e8.m_data[3] = 0.0;
    FboTestUtil::readPixels(context,local_3d0,0,0,0x80,0x80,&local_3c8,&local_3f8,&local_3e8);
  }
  Functional::Framebuffer::~Framebuffer(&fboB);
  Functional::Framebuffer::~Framebuffer(&fboA);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texShader);
  return;
}

Assistant:

void SharedColorbufferTest::render (sglr::Context& context, Surface& dst)
{
	Texture2DShader			texShader		(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
	FlatColorShader			flatShader		(glu::TYPE_FLOAT_VEC4);
	deUint32				texShaderID		= context.createProgram(&texShader);
	deUint32				flatShaderID	= context.createProgram(&flatShader);

	int						width			= 128;
	int						height			= 128;
	deUint32				quadsTex		= 1;
	deUint32				metaballsTex	= 2;
	bool					stencil			= (m_config.buffers & GL_STENCIL_BUFFER_BIT) != 0;

	context.disable(GL_DITHER);

	// Textures
	createQuadsTex2D(context, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(context, metaballsTex, GL_RGBA, GL_UNSIGNED_BYTE, 64, 64);

	context.viewport(0, 0, width, height);

	// Fbo A
	Framebuffer fboA(context, m_config, width, height);
	fboA.checkCompleteness();

	// Fbo B - don't create colorbuffer
	FboConfig cfg = m_config;
	cfg.buffers		&= ~GL_COLOR_BUFFER_BIT;
	cfg.colorType	 = GL_NONE;
	cfg.colorFormat	 = GL_NONE;
	Framebuffer fboB(context, cfg, width, height);

	// Attach color buffer from fbo A
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	switch (m_config.colorType)
	{
		case GL_TEXTURE_2D:
			context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, fboA.getColorBuffer(), 0);
			break;

		case GL_RENDERBUFFER:
			context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, fboA.getColorBuffer());
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Clear depth and stencil in fbo B
	context.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Render quads to fbo 1, with depth 0.0
	context.bindFramebuffer(GL_FRAMEBUFFER, fboA.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	if (stencil)
	{
		// Stencil to 1 in fbo A
		context.clearStencil(1);
		context.clear(GL_STENCIL_BUFFER_BIT);
	}

	texShader.setUniforms(context, texShaderID);

	context.enable(GL_DEPTH_TEST);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	context.disable(GL_DEPTH_TEST);

	// Blend metaballs to fbo 2
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	context.enable(GL_BLEND);
	context.blendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ZERO, GL_ONE);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	// Render small quad that is only visible if depth buffer is not shared with fbo A - or there is no depth bits
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.enable(GL_DEPTH_TEST);
	sglr::drawQuad(context, texShaderID, Vec3(0.5f, 0.5f, 0.5f), Vec3(1.0f, 1.0f, 0.5f));
	context.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		flatShader.setColor(context, flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		// Clear subset of stencil buffer to 1
		context.enable(GL_SCISSOR_TEST);
		context.scissor(10, 10, 12, 25);
		context.clearStencil(1);
		context.clear(GL_STENCIL_BUFFER_BIT);
		context.disable(GL_SCISSOR_TEST);

		// Render quad with stencil mask == 1
		context.enable(GL_STENCIL_TEST);
		context.stencilFunc(GL_EQUAL, 1, 0xffu);
		sglr::drawQuad(context, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.disable(GL_STENCIL_TEST);
	}

	// Get results
	if (fboA.getConfig().colorType == GL_TEXTURE_2D)
	{
		texShader.setUniforms(context, texShaderID);

		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.bindTexture(GL_TEXTURE_2D, fboA.getColorBuffer());
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		readPixels(context, dst, 0, 0, width, height, glu::mapGLInternalFormat(fboA.getConfig().colorFormat), Vec4(1.0f), Vec4(0.0f));
}